

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ArchiveProxy.cpp
# Opt level: O0

bool __thiscall
aeron::archive::ArchiveProxy::stopRecording
          (ArchiveProxy *this,int64_t subscriptionId,int64_t correlationId,int64_t controlSessionId)

{
  bool bVar1;
  StopRecordingSubscriptionRequest *pSVar2;
  uint64_t uVar3;
  undefined1 local_60 [8];
  StopRecordingSubscriptionRequest msg;
  int64_t controlSessionId_local;
  int64_t correlationId_local;
  int64_t subscriptionId_local;
  ArchiveProxy *this_local;
  
  msg.m_actingVersion = controlSessionId;
  io::aeron::archive::codecs::StopRecordingSubscriptionRequest::StopRecordingSubscriptionRequest
            ((StopRecordingSubscriptionRequest *)local_60);
  pSVar2 = wrapAndApplyHeader<io::aeron::archive::codecs::StopRecordingSubscriptionRequest>
                     (this,(StopRecordingSubscriptionRequest *)local_60);
  pSVar2 = io::aeron::archive::codecs::StopRecordingSubscriptionRequest::controlSessionId
                     (pSVar2,msg.m_actingVersion);
  pSVar2 = io::aeron::archive::codecs::StopRecordingSubscriptionRequest::correlationId
                     (pSVar2,correlationId);
  io::aeron::archive::codecs::StopRecordingSubscriptionRequest::subscriptionId
            (pSVar2,subscriptionId);
  uVar3 = io::aeron::archive::codecs::StopRecordingSubscriptionRequest::encodedLength
                    ((StopRecordingSubscriptionRequest *)local_60);
  bVar1 = offer(this,(int32_t)uVar3);
  return bVar1;
}

Assistant:

bool ArchiveProxy::stopRecording(std::int64_t subscriptionId, std::int64_t correlationId,
                                 std::int64_t controlSessionId) {
    codecs::StopRecordingSubscriptionRequest msg;

    wrapAndApplyHeader(msg)
        .controlSessionId(controlSessionId)
        .correlationId(correlationId)
        .subscriptionId(subscriptionId);

    return offer(msg.encodedLength());
}